

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void readDHT(FILE *f)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  char *local_48;
  byte local_3d;
  uint local_3c;
  uchar v_1;
  pair<unsigned_char,_unsigned_int> *ppStack_38;
  int i_1;
  pair<unsigned_char,_unsigned_int> *huffCode;
  int i;
  uint number;
  uchar a [16];
  uchar id;
  uchar DCorAC;
  uchar v [1];
  uint len;
  FILE *f_local;
  
  uVar2 = EnterNewSection(f,"DHT");
  for (a._12_4_ = uVar2 - 2; a._12_4_ != 0; a._12_4_ = a._12_4_ - (huffCode._4_4_ + 0x11)) {
    fread(a + 0xb,1,1,(FILE *)f);
    a[10] = (uchar)((int)(uint)a[0xb] >> 4);
    if (a[10] == '\0') {
      local_48 = "DC\n";
    }
    else {
      local_48 = "AC\n";
    }
    printf(local_48);
    a[9] = a[0xb] & 0xf;
    printf(anon_var_dwarf_30ab + 9,(ulong)a[9]);
    fread(&i,1,0x10,(FILE *)f);
    huffCode._4_4_ = 0;
    for (huffCode._0_4_ = 0; (int)huffCode < 0x10; huffCode._0_4_ = (int)huffCode + 1) {
      printf("%d ",(ulong)*(byte *)((long)&i + (long)(int)huffCode));
      huffCode._4_4_ = *(byte *)((long)&i + (long)(int)huffCode) + huffCode._4_4_;
    }
    printf("\n");
    ppStack_38 = createHuffCode((uchar *)&i,huffCode._4_4_);
    for (local_3c = 0; local_3c < huffCode._4_4_; local_3c = local_3c + 1) {
      fread(&local_3d,1,1,(FILE *)f);
      bVar1 = local_3d;
      pbVar3 = std::
               map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
               ::operator[](huffTable[a[10]] + a[9],ppStack_38 + (int)local_3c);
      *pbVar3 = bVar1;
      printf("%d %d: %d\n",(ulong)ppStack_38[(int)local_3c].first,
             (ulong)ppStack_38[(int)local_3c].second,(ulong)local_3d);
    }
    free(ppStack_38);
  }
  return;
}

Assistant:

void readDHT(FILE *f) {
    unsigned int len = EnterNewSection(f, "DHT");
    len -= 2;
    while (len > 0) {
        unsigned char v[1];
        fread(v, 1, 1, f);
        unsigned char DCorAC = v[0] >> 4;
        printf(DCorAC == 0 ? "DC\n" : "AC\n");
        unsigned char id = v[0] & 0x0F;
        printf("ID: %d\n", id);

        unsigned char a[16];
        fread(a, 1, 16, f);
        unsigned int number = 0;
        for (int i = 0; i < 16; i++) {
            printf("%d ", a[i]);
            number += a[i];
        }
        printf("\n");
        auto huffCode = createHuffCode(a, number);
        for (int i = 0; i < number; i++) {
            unsigned char v;
            fread(&v, 1, 1, f);
            huffTable[DCorAC][id][huffCode[i]] = v;
            printf("%d %d: %d\n", huffCode[i].first, huffCode[i].second, v);
        }
        free(huffCode);

        len -= (1 + 16 + number);
    }
}